

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-md5.c
# Opt level: O1

void bson_md5_process(bson_md5_t *md5,uint8_t *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int *piVar16;
  int *piVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint *puVar22;
  uint uVar23;
  uint *puVar24;
  int *piVar25;
  uint uVar26;
  uint uVar27;
  int *piVar28;
  uint uVar29;
  int *piVar30;
  int *piVar31;
  int *local_138;
  int *local_130;
  int *local_128;
  int *local_118;
  int *local_110;
  int *local_108;
  int *local_100;
  uint local_f8 [2];
  int local_f0;
  int local_ec;
  uint32_t local_e4;
  ulong local_d8;
  ulong local_d0;
  int local_c8 [4];
  int local_b8 [4];
  int local_a8 [4];
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  bson_md5_t *local_78;
  int local_70 [2];
  int local_68 [2];
  int local_60 [2];
  uint local_58 [2];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_38;
  int local_34;
  
  local_128 = local_b8;
  local_e4 = md5->abcd[0];
  uVar1 = md5->abcd[1];
  uVar2 = md5->abcd[2];
  local_78 = md5;
  uVar3 = md5->abcd[3];
  if (((ulong)data & 3) == 0) {
    piVar16 = (int *)(data + 4);
    puVar22 = (uint *)(data + 8);
    puVar24 = (uint *)(data + 0xc);
    piVar28 = (int *)(data + 0x10);
    piVar25 = (int *)(data + 0x14);
    piVar30 = (int *)(data + 0x18);
    piVar17 = (int *)(data + 0x1c);
    local_128 = (int *)(data + 0x20);
    local_138 = (int *)(data + 0x24);
    piVar31 = (int *)(data + 0x28);
    local_100 = (int *)(data + 0x2c);
    local_118 = (int *)(data + 0x30);
    local_130 = (int *)(data + 0x34);
    local_110 = (int *)(data + 0x38);
    local_108 = (int *)(data + 0x3c);
  }
  else {
    local_f8[0] = *(uint *)data;
    piVar16 = &local_34;
    local_34 = *(int *)(data + 4);
    puVar22 = local_58;
    local_58[0] = *(uint *)(data + 8);
    puVar24 = &local_38;
    local_38 = *(uint *)(data + 0xc);
    piVar28 = local_a8;
    local_a8[0] = *(int *)(data + 0x10);
    piVar25 = &local_3c;
    local_3c = *(int *)(data + 0x14);
    piVar30 = local_60;
    local_60[0] = *(int *)(data + 0x18);
    piVar17 = &local_40;
    local_40 = *(int *)(data + 0x1c);
    local_b8[0] = *(int *)(data + 0x20);
    local_138 = &local_44;
    local_44 = *(int *)(data + 0x24);
    piVar31 = local_68;
    local_68[0] = *(int *)(data + 0x28);
    local_100 = &local_48;
    local_48 = *(int *)(data + 0x2c);
    local_118 = local_c8;
    local_c8[0] = *(int *)(data + 0x30);
    local_130 = &local_4c;
    local_4c = *(int *)(data + 0x34);
    local_110 = local_70;
    local_70[0] = *(int *)(data + 0x38);
    local_108 = &local_50;
    local_50 = *(int *)(data + 0x3c);
    data = (uint8_t *)local_f8;
  }
  local_80 = (ulong)uVar3;
  uVar26 = *(uint *)data;
  local_d8 = (ulong)uVar26;
  uVar18 = uVar26 + ((uVar2 ^ uVar3) & uVar1 ^ uVar3) + local_e4 + 0xd76aa478;
  uVar19 = (uVar18 * 0x80 | uVar18 >> 0x19) + uVar1;
  local_88 = (ulong)uVar2;
  iVar4 = *piVar16;
  uVar18 = uVar3 + iVar4 + ((uVar1 ^ uVar2) & uVar19 ^ uVar2) + 0xe8c7b756;
  uVar15 = (uVar18 * 0x1000 | uVar18 >> 0x14) + uVar19;
  local_90 = (ulong)uVar1;
  uVar18 = *puVar22;
  local_d0 = (ulong)uVar18;
  uVar20 = uVar2 + uVar18 + ((uVar19 ^ uVar1) & uVar15 ^ uVar1) + 0x242070db;
  uVar21 = (uVar20 * 0x20000 | uVar20 >> 0xf) + uVar15;
  uVar20 = *puVar24;
  local_98 = (ulong)uVar20;
  uVar23 = uVar1 + uVar20 + ((uVar15 ^ uVar19) & uVar21 ^ uVar19) + 0xc1bdceee;
  uVar23 = (uVar23 * 0x400000 | uVar23 >> 10) + uVar21;
  iVar5 = *piVar28;
  uVar19 = ((uVar21 ^ uVar15) & uVar23 ^ uVar15) + uVar19 + iVar5 + 0xf57c0faf;
  uVar27 = (uVar19 * 0x80 | uVar19 >> 0x19) + uVar23;
  iVar6 = *piVar25;
  uVar15 = uVar15 + iVar6 + ((uVar23 ^ uVar21) & uVar27 ^ uVar21) + 0x4787c62a;
  uVar15 = (uVar15 * 0x1000 | uVar15 >> 0x14) + uVar27;
  local_ec = *piVar30;
  uVar19 = uVar21 + local_ec + ((uVar27 ^ uVar23) & uVar15 ^ uVar23) + 0xa8304613;
  uVar21 = (uVar19 * 0x20000 | uVar19 >> 0xf) + uVar15;
  local_f0 = *piVar17;
  uVar19 = ((uVar15 ^ uVar27) & uVar21 ^ uVar27) + uVar23 + local_f0 + 0xfd469501;
  uVar19 = (uVar19 * 0x400000 | uVar19 >> 10) + uVar21;
  iVar7 = *local_128;
  uVar23 = ((uVar21 ^ uVar15) & uVar19 ^ uVar15) + uVar27 + iVar7 + 0x698098d8;
  uVar27 = (uVar23 * 0x80 | uVar23 >> 0x19) + uVar19;
  iVar8 = *local_138;
  uVar15 = uVar15 + iVar8 + ((uVar19 ^ uVar21) & uVar27 ^ uVar21) + 0x8b44f7af;
  uVar15 = (uVar15 * 0x1000 | uVar15 >> 0x14) + uVar27;
  iVar9 = *piVar31;
  uVar21 = (((uVar27 ^ uVar19) & uVar15 ^ uVar19) + uVar21 + iVar9) - 0xa44f;
  uVar23 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar15;
  iVar10 = *local_100;
  uVar19 = ((uVar15 ^ uVar27) & uVar23 ^ uVar27) + uVar19 + iVar10 + 0x895cd7be;
  uVar21 = (uVar19 * 0x400000 | uVar19 >> 10) + uVar23;
  iVar11 = *local_118;
  uVar19 = ((uVar23 ^ uVar15) & uVar21 ^ uVar15) + uVar27 + iVar11 + 0x6b901122;
  uVar19 = (uVar19 * 0x80 | uVar19 >> 0x19) + uVar21;
  iVar12 = *local_130;
  uVar15 = ((uVar21 ^ uVar23) & uVar19 ^ uVar23) + uVar15 + iVar12 + 0xfd987193;
  uVar15 = (uVar15 * 0x1000 | uVar15 >> 0x14) + uVar19;
  iVar13 = *local_110;
  uVar23 = (uVar21 & ~uVar15 | uVar15 & uVar19) + uVar23 + iVar13 + 0xa679438e;
  uVar27 = (uVar23 * 0x20000 | uVar23 >> 0xf) + uVar15;
  iVar14 = *local_108;
  uVar21 = uVar21 + iVar14 + (uVar19 & ~uVar27 | uVar27 & uVar15) + 0x49b40821;
  uVar21 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar27;
  uVar19 = uVar19 + iVar4 + (~uVar15 & uVar27 | uVar21 & uVar15) + 0xf61e2562;
  uVar23 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21;
  uVar15 = uVar15 + local_ec + (~uVar27 & uVar21 | uVar23 & uVar27) + 0xc040b340;
  uVar15 = (uVar15 * 0x200 | uVar15 >> 0x17) + uVar23;
  uVar19 = uVar27 + iVar10 + ((uVar15 ^ uVar23) & uVar21 ^ uVar23) + 0x265e5a51;
  uVar27 = (uVar19 * 0x4000 | uVar19 >> 0x12) + uVar15;
  uVar19 = uVar21 + uVar26 + ((uVar27 ^ uVar15) & uVar23 ^ uVar15) + 0xe9b6c7aa;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar27;
  uVar21 = uVar23 + iVar6 + ((uVar19 ^ uVar27) & uVar15 ^ uVar27) + 0xd62f105d;
  uVar21 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar19;
  uVar15 = uVar15 + iVar9 + ((uVar21 ^ uVar19) & uVar27 ^ uVar19) + 0x2441453;
  uVar15 = (uVar15 * 0x200 | uVar15 >> 0x17) + uVar21;
  uVar23 = uVar27 + iVar14 + ((uVar15 ^ uVar21) & uVar19 ^ uVar21) + 0xd8a1e681;
  uVar27 = (uVar23 * 0x4000 | uVar23 >> 0x12) + uVar15;
  uVar19 = uVar19 + iVar5 + ((uVar27 ^ uVar15) & uVar21 ^ uVar15) + 0xe7d3fbc8;
  uVar19 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar27;
  uVar21 = uVar21 + iVar8 + ((uVar19 ^ uVar27) & uVar15 ^ uVar27) + 0x21e1cde6;
  uVar23 = (uVar21 * 0x20 | uVar21 >> 0x1b) + uVar19;
  uVar15 = uVar15 + iVar13 + ((uVar23 ^ uVar19) & uVar27 ^ uVar19) + 0xc33707d6;
  uVar15 = (uVar15 * 0x200 | uVar15 >> 0x17) + uVar23;
  uVar21 = uVar27 + uVar20 + ((uVar15 ^ uVar23) & uVar19 ^ uVar23) + 0xf4d50d87;
  uVar27 = (uVar21 * 0x4000 | uVar21 >> 0x12) + uVar15;
  uVar19 = uVar19 + iVar7 + ((uVar27 ^ uVar15) & uVar23 ^ uVar15) + 0x455a14ed;
  uVar21 = (uVar19 * 0x100000 | uVar19 >> 0xc) + uVar27;
  uVar19 = uVar23 + iVar12 + ((uVar21 ^ uVar27) & uVar15 ^ uVar27) + 0xa9e3e905;
  uVar23 = (uVar19 * 0x20 | uVar19 >> 0x1b) + uVar21;
  uVar15 = uVar15 + uVar18 + ((uVar23 ^ uVar21) & uVar27 ^ uVar21) + 0xfcefa3f8;
  uVar19 = (uVar15 * 0x200 | uVar15 >> 0x17) + uVar23;
  uVar15 = uVar27 + local_f0 + ((uVar19 ^ uVar23) & uVar21 ^ uVar23) + 0x676f02d9;
  uVar27 = (uVar15 * 0x4000 | uVar15 >> 0x12) + uVar19;
  uVar15 = ((uVar27 ^ uVar19) & uVar23 ^ uVar19) + uVar21 + iVar11 + 0x8d2a4c8a;
  uVar15 = (uVar15 * 0x100000 | uVar15 >> 0xc) + uVar27;
  uVar21 = ((uVar15 ^ uVar27 ^ uVar19) + uVar23 + iVar6) - 0x5c6be;
  uVar23 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar15;
  uVar19 = (uVar15 ^ uVar27 ^ uVar23) + uVar19 + iVar7 + 0x8771f681;
  uVar19 = (uVar19 * 0x800 | uVar19 >> 0x15) + uVar23;
  uVar21 = (uVar23 ^ uVar15 ^ uVar19) + uVar27 + iVar10 + 0x6d9d6122;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar19;
  uVar15 = (uVar19 ^ uVar23 ^ uVar21) + uVar15 + iVar13 + 0xfde5380c;
  uVar15 = (uVar15 * 0x800000 | uVar15 >> 9) + uVar21;
  uVar23 = (uVar21 ^ uVar19 ^ uVar15) + uVar23 + iVar4 + 0xa4beea44;
  uVar23 = (uVar23 * 0x10 | uVar23 >> 0x1c) + uVar15;
  uVar19 = uVar19 + iVar5 + (uVar15 ^ uVar21 ^ uVar23) + 0x4bdecfa9;
  uVar19 = (uVar19 * 0x800 | uVar19 >> 0x15) + uVar23;
  uVar21 = uVar21 + local_f0 + (uVar23 ^ uVar15 ^ uVar19) + 0xf6bb4b60;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar19;
  uVar15 = uVar15 + iVar9 + (uVar19 ^ uVar23 ^ uVar21) + 0xbebfbc70;
  uVar15 = (uVar15 * 0x800000 | uVar15 >> 9) + uVar21;
  uVar23 = uVar23 + iVar12 + (uVar21 ^ uVar19 ^ uVar15) + 0x289b7ec6;
  uVar27 = (uVar23 * 0x10 | uVar23 >> 0x1c) + uVar15;
  uVar19 = uVar19 + uVar26 + (uVar15 ^ uVar21 ^ uVar27) + 0xeaa127fa;
  uVar19 = (uVar19 * 0x800 | uVar19 >> 0x15) + uVar27;
  uVar21 = (uVar27 ^ uVar15 ^ uVar19) + uVar21 + uVar20 + 0xd4ef3085;
  uVar23 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar19;
  uVar15 = (uVar19 ^ uVar27 ^ uVar23) + uVar15 + local_ec + 0x4881d05;
  uVar15 = (uVar15 * 0x800000 | uVar15 >> 9) + uVar23;
  uVar21 = (uVar23 ^ uVar19 ^ uVar15) + uVar27 + iVar8 + 0xd9d4d039;
  uVar21 = (uVar21 * 0x10 | uVar21 >> 0x1c) + uVar15;
  uVar19 = (uVar15 ^ uVar23 ^ uVar21) + uVar19 + iVar11 + 0xe6db99e5;
  uVar29 = (uVar19 * 0x800 | uVar19 >> 0x15) + uVar21;
  uVar19 = (uVar21 ^ uVar15 ^ uVar29) + uVar23 + iVar14 + 0x1fa27cf8;
  uVar19 = (uVar19 * 0x10000 | uVar19 >> 0x10) + uVar29;
  uVar15 = (uVar29 ^ uVar21 ^ uVar19) + uVar15 + uVar18 + 0xc4ac5665;
  uVar15 = (uVar15 * 0x800000 | uVar15 >> 9) + uVar19;
  uVar26 = uVar21 + uVar26 + ((~uVar29 | uVar15) ^ uVar19) + 0xf4292244;
  uVar27 = (uVar26 * 0x40 | uVar26 >> 0x1a) + uVar15;
  uVar26 = ((~uVar19 | uVar27) ^ uVar15) + uVar29 + local_f0 + 0x432aff97;
  uVar21 = (uVar26 * 0x400 | uVar26 >> 0x16) + uVar27;
  uVar26 = ((~uVar15 | uVar21) ^ uVar27) + uVar19 + iVar13 + 0xab9423a7;
  uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar21;
  uVar15 = uVar15 + iVar6 + ((~uVar27 | uVar26) ^ uVar21) + 0xfc93a039;
  uVar23 = (uVar15 * 0x200000 | uVar15 >> 0xb) + uVar26;
  uVar15 = ((~uVar21 | uVar23) ^ uVar26) + uVar27 + iVar11 + 0x655b59c3;
  uVar15 = (uVar15 * 0x40 | uVar15 >> 0x1a) + uVar23;
  uVar20 = uVar21 + uVar20 + ((~uVar26 | uVar15) ^ uVar23) + 0x8f0ccc92;
  uVar19 = (uVar20 * 0x400 | uVar20 >> 0x16) + uVar15;
  uVar26 = (uVar26 + iVar9 + ((~uVar23 | uVar19) ^ uVar15)) - 0x100b83;
  uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar19;
  uVar20 = uVar23 + iVar4 + ((~uVar15 | uVar26) ^ uVar19) + 0x85845dd1;
  uVar21 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar26;
  uVar20 = uVar15 + iVar7 + ((~uVar19 | uVar21) ^ uVar26) + 0x6fa87e4f;
  uVar20 = (uVar20 * 0x40 | uVar20 >> 0x1a) + uVar21;
  uVar15 = uVar19 + iVar14 + ((~uVar26 | uVar20) ^ uVar21) + 0xfe2ce6e0;
  uVar15 = (uVar15 * 0x400 | uVar15 >> 0x16) + uVar20;
  uVar26 = uVar26 + local_ec + ((~uVar21 | uVar15) ^ uVar20) + 0xa3014314;
  uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar15;
  uVar19 = uVar21 + iVar12 + ((~uVar20 | uVar26) ^ uVar15) + 0x4e0811a1;
  uVar19 = (uVar19 * 0x200000 | uVar19 >> 0xb) + uVar26;
  uVar20 = uVar20 + iVar5 + ((~uVar15 | uVar19) ^ uVar26) + 0xf7537e82;
  uVar20 = (uVar20 * 0x40 | uVar20 >> 0x1a) + uVar19;
  uVar15 = uVar15 + iVar10 + ((~uVar26 | uVar20) ^ uVar19) + 0xbd3af235;
  uVar15 = (uVar15 * 0x400 | uVar15 >> 0x16) + uVar20;
  uVar26 = uVar26 + uVar18 + ((~uVar19 | uVar15) ^ uVar20) + 0x2ad7d2bb;
  uVar26 = (uVar26 * 0x8000 | uVar26 >> 0x11) + uVar15;
  uVar18 = ((~uVar20 | uVar26) ^ uVar15) + uVar19 + iVar8 + 0xeb86d391;
  md5->abcd[0] = uVar20 + local_e4;
  md5->abcd[1] = uVar1 + uVar26 + (uVar18 * 0x200000 | uVar18 >> 0xb);
  md5->abcd[2] = uVar26 + uVar2;
  md5->abcd[3] = uVar15 + uVar3;
  return;
}

Assistant:

static void
bson_md5_process (bson_md5_t *md5, const uint8_t *data)
{
   uint32_t a = md5->abcd[0];
   uint32_t b = md5->abcd[1];
   uint32_t c = md5->abcd[2];
   uint32_t d = md5->abcd[3];
   uint32_t t;

#if BYTE_ORDER > 0
   /* Define storage only for big-endian CPUs. */
   uint32_t X[16];
#else
   /* Define storage for little-endian or both types of CPUs. */
   uint32_t xbuf[16];
   const uint32_t *X;
#endif

   {
#if BYTE_ORDER == 0
      /*
       * Determine dynamically whether this is a big-endian or
       * little-endian machine, since we can use a more efficient
       * algorithm on the latter.
       */
      static const int w = 1;

      if (*((const uint8_t *) &w)) /* dynamic little-endian */
#endif
#if BYTE_ORDER <= 0 /* little-endian */
      {
         /*
          * On little-endian machines, we can process properly aligned
          * data without copying it.
          */
         if (!((data - (const uint8_t *) 0) & 3)) {
/* data are properly aligned */
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-align"
#endif
            X = (const uint32_t *) data;
#ifdef __clang__
#pragma clang diagnostic pop
#endif
         } else {
            /* not aligned */
            memcpy (xbuf, data, sizeof (xbuf));
            X = xbuf;
         }
      }
#endif
#if BYTE_ORDER == 0
      else /* dynamic big-endian */
#endif
#if BYTE_ORDER >= 0 /* big-endian */
      {
         /*
          * On big-endian machines, we must arrange the bytes in the
          * right order.
          */
         const uint8_t *xp = data;
         int i;

#if BYTE_ORDER == 0
         X = xbuf; /* (dynamic only) */
#else
#define xbuf X /* (static only) */
#endif
         for (i = 0; i < 16; ++i, xp += 4)
            xbuf[i] = xp[0] + (xp[1] << 8) + (xp[2] << 16) + (xp[3] << 24);
      }
#endif
   }

#define ROTATE_LEFT(x, n) (((x) << (n)) | ((x) >> (32 - (n))))

/* Round 1. */
/* Let [abcd k s i] denote the operation
   a = b + ((a + F(b,c,d) + X[k] + T[i]) <<< s). */
#define F(x, y, z) (((x) & (y)) | (~(x) & (z)))
#define SET(a, b, c, d, k, s, Ti)   \
   t = a + F (b, c, d) + X[k] + Ti; \
   a = ROTATE_LEFT (t, s) + b
   /* Do the following 16 operations. */
   SET (a, b, c, d, 0, 7, T1);
   SET (d, a, b, c, 1, 12, T2);
   SET (c, d, a, b, 2, 17, T3);
   SET (b, c, d, a, 3, 22, T4);
   SET (a, b, c, d, 4, 7, T5);
   SET (d, a, b, c, 5, 12, T6);
   SET (c, d, a, b, 6, 17, T7);
   SET (b, c, d, a, 7, 22, T8);
   SET (a, b, c, d, 8, 7, T9);
   SET (d, a, b, c, 9, 12, T10);
   SET (c, d, a, b, 10, 17, T11);
   SET (b, c, d, a, 11, 22, T12);
   SET (a, b, c, d, 12, 7, T13);
   SET (d, a, b, c, 13, 12, T14);
   SET (c, d, a, b, 14, 17, T15);
   SET (b, c, d, a, 15, 22, T16);
#undef SET

/* Round 2. */
/* Let [abcd k s i] denote the operation
     a = b + ((a + G(b,c,d) + X[k] + T[i]) <<< s). */
#define G(x, y, z) (((x) & (z)) | ((y) & ~(z)))
#define SET(a, b, c, d, k, s, Ti)   \
   t = a + G (b, c, d) + X[k] + Ti; \
   a = ROTATE_LEFT (t, s) + b
   /* Do the following 16 operations. */
   SET (a, b, c, d, 1, 5, T17);
   SET (d, a, b, c, 6, 9, T18);
   SET (c, d, a, b, 11, 14, T19);
   SET (b, c, d, a, 0, 20, T20);
   SET (a, b, c, d, 5, 5, T21);
   SET (d, a, b, c, 10, 9, T22);
   SET (c, d, a, b, 15, 14, T23);
   SET (b, c, d, a, 4, 20, T24);
   SET (a, b, c, d, 9, 5, T25);
   SET (d, a, b, c, 14, 9, T26);
   SET (c, d, a, b, 3, 14, T27);
   SET (b, c, d, a, 8, 20, T28);
   SET (a, b, c, d, 13, 5, T29);
   SET (d, a, b, c, 2, 9, T30);
   SET (c, d, a, b, 7, 14, T31);
   SET (b, c, d, a, 12, 20, T32);
#undef SET

/* Round 3. */
/* Let [abcd k s t] denote the operation
     a = b + ((a + H(b,c,d) + X[k] + T[i]) <<< s). */
#define H(x, y, z) ((x) ^ (y) ^ (z))
#define SET(a, b, c, d, k, s, Ti)   \
   t = a + H (b, c, d) + X[k] + Ti; \
   a = ROTATE_LEFT (t, s) + b
   /* Do the following 16 operations. */
   SET (a, b, c, d, 5, 4, T33);
   SET (d, a, b, c, 8, 11, T34);
   SET (c, d, a, b, 11, 16, T35);
   SET (b, c, d, a, 14, 23, T36);
   SET (a, b, c, d, 1, 4, T37);
   SET (d, a, b, c, 4, 11, T38);
   SET (c, d, a, b, 7, 16, T39);
   SET (b, c, d, a, 10, 23, T40);
   SET (a, b, c, d, 13, 4, T41);
   SET (d, a, b, c, 0, 11, T42);
   SET (c, d, a, b, 3, 16, T43);
   SET (b, c, d, a, 6, 23, T44);
   SET (a, b, c, d, 9, 4, T45);
   SET (d, a, b, c, 12, 11, T46);
   SET (c, d, a, b, 15, 16, T47);
   SET (b, c, d, a, 2, 23, T48);
#undef SET

/* Round 4. */
/* Let [abcd k s t] denote the operation
     a = b + ((a + I(b,c,d) + X[k] + T[i]) <<< s). */
#define I(x, y, z) ((y) ^ ((x) | ~(z)))
#define SET(a, b, c, d, k, s, Ti)   \
   t = a + I (b, c, d) + X[k] + Ti; \
   a = ROTATE_LEFT (t, s) + b
   /* Do the following 16 operations. */
   SET (a, b, c, d, 0, 6, T49);
   SET (d, a, b, c, 7, 10, T50);
   SET (c, d, a, b, 14, 15, T51);
   SET (b, c, d, a, 5, 21, T52);
   SET (a, b, c, d, 12, 6, T53);
   SET (d, a, b, c, 3, 10, T54);
   SET (c, d, a, b, 10, 15, T55);
   SET (b, c, d, a, 1, 21, T56);
   SET (a, b, c, d, 8, 6, T57);
   SET (d, a, b, c, 15, 10, T58);
   SET (c, d, a, b, 6, 15, T59);
   SET (b, c, d, a, 13, 21, T60);
   SET (a, b, c, d, 4, 6, T61);
   SET (d, a, b, c, 11, 10, T62);
   SET (c, d, a, b, 2, 15, T63);
   SET (b, c, d, a, 9, 21, T64);
#undef SET

   /* Then perform the following additions. (That is increment each
      of the four registers by the value it had before this block
      was started.) */
   md5->abcd[0] += a;
   md5->abcd[1] += b;
   md5->abcd[2] += c;
   md5->abcd[3] += d;
}